

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConvexPolyhedron.cpp
# Opt level: O1

void __thiscall cbtConvexPolyhedron::initialize(cbtConvexPolyhedron *this)

{
  int *piVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  float fVar4;
  float fVar5;
  short sVar6;
  int iVar7;
  cbtVector3 *ptr;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined1 auVar11 [16];
  undefined8 uVar12;
  short tmp;
  int iVar13;
  long lVar14;
  cbtVector3 *pcVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  ulong uVar19;
  cbtInternalEdge *pcVar20;
  ulong uVar21;
  ulong uVar22;
  float fVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  cbtInternalVertexPair vp;
  cbtInternalEdge ed;
  cbtHashMap<cbtInternalVertexPair,_cbtInternalEdge> edges;
  cbtInternalVertexPair local_100;
  cbtInternalEdge local_fc;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  long local_c0;
  long local_b8;
  cbtHashMap<cbtInternalVertexPair,_cbtInternalEdge> local_b0;
  
  local_b0.m_hashTable.m_ownsMemory = true;
  local_b0.m_hashTable.m_data = (int *)0x0;
  local_b0.m_hashTable.m_size = 0;
  local_b0.m_hashTable.m_capacity = 0;
  local_b0.m_next.m_ownsMemory = true;
  local_b0.m_next.m_data = (int *)0x0;
  local_b0.m_next.m_size = 0;
  local_b0.m_next.m_capacity = 0;
  local_b0.m_valueArray.m_ownsMemory = true;
  local_b0.m_valueArray.m_data = (cbtInternalEdge *)0x0;
  local_b0.m_valueArray.m_size = 0;
  local_b0.m_valueArray.m_capacity = 0;
  local_b0.m_keyArray.m_ownsMemory = true;
  local_b0.m_keyArray.m_data = (cbtInternalVertexPair *)0x0;
  local_b0.m_keyArray.m_size = 0;
  local_b0.m_keyArray.m_capacity = 0;
  if (0 < (this->m_faces).m_size) {
    lVar16 = 0;
    do {
      local_b8 = lVar16 * 0x30;
      uVar21 = (ulong)(this->m_faces).m_data[lVar16].m_indices.m_size;
      if (0 < (long)uVar21) {
        uVar22 = 0;
        local_c0 = lVar16;
        do {
          lVar14 = *(long *)((long)((this->m_faces).m_data)->m_plane + local_b8 + -0x10);
          sVar6 = *(short *)(lVar14 + uVar22 * 4);
          uVar22 = uVar22 + 1;
          uVar19 = 0;
          if (uVar22 != uVar21) {
            uVar19 = uVar22 & 0xffffffff;
          }
          local_100.m_v1 = *(short *)(lVar14 + uVar19 * 4);
          local_100.m_v0 = sVar6;
          if (sVar6 < local_100.m_v1) {
            local_100.m_v0 = local_100.m_v1;
            local_100.m_v1 = sVar6;
          }
          iVar13 = cbtHashMap<cbtInternalVertexPair,_cbtInternalEdge>::findIndex
                             (&local_b0,&local_100);
          pcVar20 = (cbtInternalEdge *)0x0;
          if (iVar13 != -1) {
            pcVar20 = local_b0.m_valueArray.m_data + iVar13;
          }
          lVar14 = (long)local_100.m_v1;
          pcVar15 = (this->m_vertices).m_data;
          lVar17 = (long)local_100.m_v0;
          fVar8 = pcVar15[lVar14].m_floats[0] - pcVar15[lVar17].m_floats[0];
          fVar9 = pcVar15[lVar14].m_floats[1] - pcVar15[lVar17].m_floats[1];
          fVar10 = pcVar15[lVar14].m_floats[2] - pcVar15[lVar17].m_floats[2];
          auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar9 * fVar9)),ZEXT416((uint)fVar8),
                                    ZEXT416((uint)fVar8));
          auVar11 = vfmadd231ss_fma(auVar11,ZEXT416((uint)fVar10),ZEXT416((uint)fVar10));
          if (auVar11._0_4_ < 0.0) {
            local_d8._0_4_ = fVar8;
            local_e8._0_4_ = fVar9;
            local_f8._0_4_ = fVar10;
            fVar23 = sqrtf(auVar11._0_4_);
          }
          else {
            auVar11 = vsqrtss_avx(auVar11,auVar11);
            fVar23 = auVar11._0_4_;
            local_e8._0_4_ = fVar9;
            local_d8._0_4_ = fVar8;
            local_f8._0_4_ = fVar10;
          }
          fVar23 = 1.0 / fVar23;
          fVar8 = (float)local_d8._0_4_ * fVar23;
          local_d8 = ZEXT416((uint)fVar8);
          fVar9 = (float)local_e8._0_4_ * fVar23;
          local_e8 = ZEXT416((uint)fVar9);
          fVar23 = (float)local_f8._0_4_ * fVar23;
          local_f8 = ZEXT416((uint)fVar23);
          iVar13 = (this->m_uniqueEdges).m_size;
          if (0 < (long)iVar13) {
            pcVar15 = (this->m_uniqueEdges).m_data;
            lVar14 = 0;
            do {
              fVar10 = *(float *)((long)pcVar15->m_floats + lVar14);
              fVar4 = *(float *)((long)pcVar15->m_floats + lVar14 + 4);
              fVar5 = *(float *)((long)pcVar15->m_floats + lVar14 + 8);
              auVar25._8_4_ = 0x7fffffff;
              auVar25._0_8_ = 0x7fffffff7fffffff;
              auVar25._12_4_ = 0x7fffffff;
              auVar11 = vandps_avx(ZEXT416((uint)(fVar10 - fVar8)),auVar25);
              if ((((auVar11._0_4_ <= 1e-06) &&
                   (auVar11 = vandps_avx(ZEXT416((uint)(fVar4 - fVar9)),auVar25),
                   auVar11._0_4_ <= 1e-06)) &&
                  (auVar11 = vandps_avx(ZEXT416((uint)(fVar5 - fVar23)),auVar25),
                  auVar11._0_4_ <= 1e-06)) ||
                 (((auVar11 = vandps_avx(ZEXT416((uint)(fVar10 + fVar8)),auVar25),
                   auVar11._0_4_ <= 1e-06 &&
                   (auVar11 = vandps_avx(ZEXT416((uint)(fVar4 + fVar9)),auVar25),
                   auVar11._0_4_ <= 1e-06)) &&
                  (auVar11 = vandps_avx(ZEXT416((uint)(fVar5 + fVar23)),auVar25),
                  auVar11._0_4_ <= 1e-06)))) goto LAB_00903834;
              lVar14 = lVar14 + 0x10;
            } while ((long)iVar13 << 4 != lVar14);
          }
          iVar7 = (this->m_uniqueEdges).m_capacity;
          if (iVar13 == iVar7) {
            iVar18 = iVar13 * 2;
            if (iVar13 == 0) {
              iVar18 = 1;
            }
            if (iVar7 < iVar18) {
              if (iVar18 == 0) {
                pcVar15 = (cbtVector3 *)0x0;
              }
              else {
                pcVar15 = (cbtVector3 *)cbtAlignedAllocInternal((long)iVar18 << 4,0x10);
              }
              lVar16 = (long)(this->m_uniqueEdges).m_size;
              if (0 < lVar16) {
                lVar14 = 0;
                do {
                  puVar2 = (undefined8 *)((long)((this->m_uniqueEdges).m_data)->m_floats + lVar14);
                  uVar12 = puVar2[1];
                  puVar3 = (undefined8 *)((long)pcVar15->m_floats + lVar14);
                  *puVar3 = *puVar2;
                  puVar3[1] = uVar12;
                  lVar14 = lVar14 + 0x10;
                } while (lVar16 * 0x10 != lVar14);
              }
              ptr = (this->m_uniqueEdges).m_data;
              if (ptr != (cbtVector3 *)0x0) {
                if ((this->m_uniqueEdges).m_ownsMemory == true) {
                  cbtAlignedFreeInternal(ptr);
                }
                (this->m_uniqueEdges).m_data = (cbtVector3 *)0x0;
              }
              (this->m_uniqueEdges).m_ownsMemory = true;
              (this->m_uniqueEdges).m_data = pcVar15;
              (this->m_uniqueEdges).m_capacity = iVar18;
              lVar16 = local_c0;
            }
          }
          auVar11 = vinsertps_avx(local_d8,ZEXT416((uint)local_e8._0_4_),0x10);
          auVar24._4_8_ = SUB128(ZEXT812(0),4);
          auVar24._0_4_ = local_f8._0_4_;
          auVar24._12_4_ = 0;
          auVar11 = vmovlhps_avx(auVar11,auVar24);
          *(undefined1 (*) [16])(this->m_uniqueEdges).m_data[(this->m_uniqueEdges).m_size].m_floats
               = auVar11;
          piVar1 = &(this->m_uniqueEdges).m_size;
          *piVar1 = *piVar1 + 1;
LAB_00903834:
          if (pcVar20 == (cbtInternalEdge *)0x0) {
            local_fc.m_face1 = -1;
            local_fc.m_face0 = (short)lVar16;
            cbtHashMap<cbtInternalVertexPair,_cbtInternalEdge>::insert
                      (&local_b0,&local_100,&local_fc);
          }
          else {
            pcVar20->m_face1 = (short)lVar16;
          }
        } while (uVar22 != uVar21);
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 < (this->m_faces).m_size);
  }
  initialize2(this);
  cbtAlignedObjectArray<cbtInternalVertexPair>::~cbtAlignedObjectArray(&local_b0.m_keyArray);
  cbtAlignedObjectArray<cbtInternalEdge>::~cbtAlignedObjectArray(&local_b0.m_valueArray);
  cbtAlignedObjectArray<int>::~cbtAlignedObjectArray(&local_b0.m_next);
  cbtAlignedObjectArray<int>::~cbtAlignedObjectArray(&local_b0.m_hashTable);
  return;
}

Assistant:

void cbtConvexPolyhedron::initialize()
{
	cbtHashMap<cbtInternalVertexPair, cbtInternalEdge> edges;

	for (int i = 0; i < m_faces.size(); i++)
	{
		int numVertices = m_faces[i].m_indices.size();
		int NbTris = numVertices;
		for (int j = 0; j < NbTris; j++)
		{
			int k = (j + 1) % numVertices;
			cbtInternalVertexPair vp(m_faces[i].m_indices[j], m_faces[i].m_indices[k]);
			cbtInternalEdge* edptr = edges.find(vp);
			cbtVector3 edge = m_vertices[vp.m_v1] - m_vertices[vp.m_v0];
			edge.normalize();

			bool found = false;

			for (int p = 0; p < m_uniqueEdges.size(); p++)
			{
				if (IsAlmostZero1(m_uniqueEdges[p] - edge) ||
					IsAlmostZero1(m_uniqueEdges[p] + edge))
				{
					found = true;
					break;
				}
			}

			if (!found)
			{
				m_uniqueEdges.push_back(edge);
			}

			if (edptr)
			{
				cbtAssert(edptr->m_face0 >= 0);
				cbtAssert(edptr->m_face1 < 0);
				edptr->m_face1 = i;
			}
			else
			{
				cbtInternalEdge ed;
				ed.m_face0 = i;
				edges.insert(vp, ed);
			}
		}
	}

#ifdef USE_CONNECTED_FACES
	for (int i = 0; i < m_faces.size(); i++)
	{
		int numVertices = m_faces[i].m_indices.size();
		m_faces[i].m_connectedFaces.resize(numVertices);

		for (int j = 0; j < numVertices; j++)
		{
			int k = (j + 1) % numVertices;
			cbtInternalVertexPair vp(m_faces[i].m_indices[j], m_faces[i].m_indices[k]);
			cbtInternalEdge* edptr = edges.find(vp);
			cbtAssert(edptr);
			cbtAssert(edptr->m_face0 >= 0);
			cbtAssert(edptr->m_face1 >= 0);

			int connectedFace = (edptr->m_face0 == i) ? edptr->m_face1 : edptr->m_face0;
			m_faces[i].m_connectedFaces[j] = connectedFace;
		}
	}
#endif  //USE_CONNECTED_FACES

	initialize2();
}